

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_nls.c
# Opt level: O0

int mriStep_NlsInit(ARKodeMem ark_mem)

{
  void *pvVar1;
  int iVar2;
  ARKodeMem in_RDI;
  int retval;
  ARKodeMRIStepMem step_mem;
  SUNNonlinearSolver in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  int local_4;
  
  if (in_RDI->step_mem == (void *)0x0) {
    arkProcessError(in_RDI,-0x15,"ARKode::MRIStep","mriStep_NlsInit",
                    "Time step module memory is NULL.");
    local_4 = -0x15;
  }
  else {
    pvVar1 = in_RDI->step_mem;
    *(undefined8 *)((long)pvVar1 + 0x180) = 0;
    *(undefined8 *)((long)pvVar1 + 0x188) = 0;
    if (*(long *)((long)pvVar1 + 0x130) == 0) {
      iVar2 = SUNNonlinSolSetLSetupFn(in_stack_ffffffffffffffd8,(SUNNonlinSolLSetupFn)0x11854ae);
    }
    else {
      iVar2 = SUNNonlinSolSetLSetupFn(in_stack_ffffffffffffffd8,(SUNNonlinSolLSetupFn)0x1185493);
    }
    if (iVar2 == 0) {
      if (*(long *)((long)pvVar1 + 0x138) == 0) {
        iVar2 = SUNNonlinSolSetLSolveFn(in_stack_ffffffffffffffd8,(SUNNonlinSolLSolveFn)0x118552e);
      }
      else {
        iVar2 = SUNNonlinSolSetLSolveFn(in_stack_ffffffffffffffd8,(SUNNonlinSolLSolveFn)0x1185513);
      }
      if (iVar2 == 0) {
        iVar2 = SUNNonlinSolInitialize((SUNNonlinearSolver)(ulong)in_stack_ffffffffffffffe0);
        if (iVar2 == 0) {
          local_4 = 0;
        }
        else {
          arkProcessError(in_RDI,-0x16,"ARKode::MRIStep","mriStep_NlsInit",
                          "The nonlinear solver\'s init routine failed.");
          local_4 = -0x1d;
        }
      }
      else {
        arkProcessError(in_RDI,-0x16,"ARKode::MRIStep","mriStep_NlsInit",
                        "Setting linear solver solve function failed");
        local_4 = -0x1d;
      }
    }
    else {
      arkProcessError(in_RDI,-0x16,"ARKode::MRIStep","mriStep_NlsInit",
                      "Setting the linear solver setup function failed");
      local_4 = -0x1d;
    }
  }
  return local_4;
}

Assistant:

int mriStep_NlsInit(ARKodeMem ark_mem)
{
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  if (ark_mem->step_mem==NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::MRIStep",
                    "mriStep_NlsInit", MSG_MRISTEP_NO_MEM);
    return(ARK_MEM_NULL);
  }
  step_mem = (ARKodeMRIStepMem) ark_mem->step_mem;

  /* reset counters */
  step_mem->nls_iters = 0;
  step_mem->nls_fails = 0;

  /* set the linear solver setup wrapper function */
  if (step_mem->lsetup)
    retval = SUNNonlinSolSetLSetupFn(step_mem->NLS, mriStep_NlsLSetup);
  else
    retval = SUNNonlinSolSetLSetupFn(step_mem->NLS, NULL);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "mriStep_NlsInit",
                    "Setting the linear solver setup function failed");
    return(ARK_NLS_INIT_FAIL);
  }

  /* set the linear solver solve wrapper function */
  if (step_mem->lsolve)
    retval = SUNNonlinSolSetLSolveFn(step_mem->NLS, mriStep_NlsLSolve);
  else
    retval = SUNNonlinSolSetLSolveFn(step_mem->NLS, NULL);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "mriStep_NlsInit",
                    "Setting linear solver solve function failed");
    return(ARK_NLS_INIT_FAIL);
  }

  /* initialize nonlinear solver */
  retval = SUNNonlinSolInitialize(step_mem->NLS);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "mriStep_NlsInit", MSG_NLS_INIT_FAIL);
    return(ARK_NLS_INIT_FAIL);
  }

  return(ARK_SUCCESS);
}